

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O3

bool __thiscall QThreadPool::tryStart(QThreadPool *this,function<void_()> functionToRun)

{
  __base_type copy;
  QThreadPoolPrivate *this_00;
  Data *pDVar1;
  code *pcVar2;
  QMutex *this_01;
  QRunnable *task;
  undefined8 *in_RSI;
  long in_FS_OFFSET;
  bool bVar3;
  _Any_data local_48;
  code *local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI[2] == 0) {
    bVar3 = false;
    goto LAB_001f745d;
  }
  this_00 = (QThreadPoolPrivate *)(this->super_QObject).d_ptr.d;
  this_01 = &this_00->mutex;
  if ((this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar3 = (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar3) {
      (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar3) goto LAB_001f73a3;
  }
  else {
LAB_001f73a3:
    QBasicMutex::lockInternal(&this_01->super_QBasicMutex);
  }
  pDVar1 = (this_00->allThreads).q_hash.d;
  if (((pDVar1 == (Data *)0x0) || (pDVar1->size == 0)) ||
     (bVar3 = QThreadPoolPrivate::areAllThreadsActive(this_00), !bVar3)) {
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_38 = (code *)0x0;
    local_30 = in_RSI[3];
    pcVar2 = (code *)in_RSI[2];
    if (pcVar2 != (code *)0x0) {
      local_48._M_unused._0_8_ = (undefined8)*in_RSI;
      local_48._8_8_ = in_RSI[1];
      in_RSI[2] = 0;
      in_RSI[3] = 0;
      local_38 = pcVar2;
    }
    task = QRunnable::create<std::function<void_()>,_true>((function<void_()> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    bVar3 = QThreadPoolPrivate::tryStart(this_00,task);
    if (task != (QRunnable *)0x0 && !bVar3) {
      (*task->_vptr_QRunnable[2])(task);
      goto LAB_001f7444;
    }
  }
  else {
LAB_001f7444:
    bVar3 = false;
  }
  LOCK();
  copy._M_p = (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy._M_p != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_01->super_QBasicMutex,copy._M_p);
  }
LAB_001f745d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QThreadPool::tryStart(std::function<void()> functionToRun)
{
    if (!functionToRun)
        return false;

    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);
    if (!d->allThreads.isEmpty() && d->areAllThreadsActive())
        return false;

    QRunnable *runnable = QRunnable::create(std::move(functionToRun));
    if (d->tryStart(runnable))
        return true;
    delete runnable;
    return false;
}